

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_custom_secret_storage.cpp
# Opt level: O3

void __thiscall
TestSecretStorage::TestSecretStorage
          (TestSecretStorage *this,string *name_p,DatabaseInstance *db,TestSecretLog *logger_p,
          int64_t tie_break_offset_p)

{
  pointer pcVar1;
  undefined8 uVar2;
  pointer __p;
  pointer *__ptr;
  
  *(undefined ***)this = &PTR__SecretStorage_005cb590;
  *(undefined1 **)&this->field_0x8 = &this->field_0x18;
  pcVar1 = (name_p->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->field_0x8,pcVar1,pcVar1 + name_p->_M_string_length);
  *(int64_t *)&this->field_0x28 = tie_break_offset_p;
  this->field_0x30 = 0;
  *(undefined8 *)&this->field_0x38 = 0;
  *(DatabaseInstance **)&this->field_0x40 = db;
  *(undefined ***)this = &PTR__CatalogSetSecretStorage_005cb508;
  this->logger = logger_p;
  uVar2 = duckdb::Catalog::GetSystemCatalog(db);
  __p = (pointer)operator_new(0x68);
  duckdb::CatalogSet::CatalogSet(__p,uVar2);
  std::__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>::reset
            ((__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_> *)
             &this->field_0x38,__p);
  this->field_0x30 = 1;
  this->include_in_lookups = true;
  return;
}

Assistant:

TestSecretStorage(const string &name_p, DatabaseInstance &db, TestSecretLog &logger_p, int64_t tie_break_offset_p)
	    : CatalogSetSecretStorage(db, name_p, tie_break_offset_p), logger(logger_p) {
		secrets = make_uniq<CatalogSet>(Catalog::GetSystemCatalog(db));
		persistent = true;
		include_in_lookups = true;
	}